

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error FT_Stroker_GetBorderCounts
                   (FT_Stroker stroker,FT_StrokerBorder border,FT_UInt *anum_points,
                   FT_UInt *anum_contours)

{
  FT_Error local_34;
  FT_UInt local_30;
  FT_Error error;
  FT_UInt num_contours;
  FT_UInt num_points;
  FT_UInt *anum_contours_local;
  FT_UInt *anum_points_local;
  FT_Stroker pFStack_10;
  FT_StrokerBorder border_local;
  FT_Stroker stroker_local;
  
  error = 0;
  local_30 = 0;
  _num_contours = anum_contours;
  anum_contours_local = anum_points;
  if ((stroker == (FT_Stroker)0x0) || (FT_STROKER_BORDER_RIGHT < border)) {
    local_34 = 6;
  }
  else {
    anum_points_local._4_4_ = border;
    pFStack_10 = stroker;
    local_34 = ft_stroke_border_get_counts(stroker->borders + border,(FT_UInt *)&error,&local_30);
  }
  if (anum_contours_local != (FT_UInt *)0x0) {
    *anum_contours_local = error;
  }
  if (_num_contours != (FT_UInt *)0x0) {
    *_num_contours = local_30;
  }
  return local_34;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_GetBorderCounts( FT_Stroker        stroker,
                              FT_StrokerBorder  border,
                              FT_UInt          *anum_points,
                              FT_UInt          *anum_contours )
  {
    FT_UInt   num_points = 0, num_contours = 0;
    FT_Error  error;


    if ( !stroker || border > 1 )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    error = ft_stroke_border_get_counts( stroker->borders + border,
                                         &num_points, &num_contours );
  Exit:
    if ( anum_points )
      *anum_points = num_points;

    if ( anum_contours )
      *anum_contours = num_contours;

    return error;
  }